

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  int iVar1;
  char *pcVar2;
  int local_4c;
  sqlite3_io_methods *psStack_48;
  int rc_1;
  i64 newLimit;
  char *zTFile;
  int rc;
  unixFile *pFile;
  void *pArg_local;
  int op_local;
  sqlite3_file *id_local;
  
  switch(op) {
  case 1:
    *(uint *)pArg = (uint)*(byte *)((long)&id[3].pMethods + 4);
    id_local._4_4_ = 0;
    break;
  default:
    id_local._4_4_ = 0xc;
    break;
  case 4:
    *(undefined4 *)pArg = *(undefined4 *)&id[4].pMethods;
    id_local._4_4_ = 0;
    break;
  case 5:
    id_local._4_4_ = fcntlSizeHint((unixFile *)id,*pArg);
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    id_local._4_4_ = 0;
    break;
  case 10:
    unixModeBit((unixFile *)id,'\x04',(int *)pArg);
    id_local._4_4_ = 0;
    break;
  case 0xc:
    pcVar2 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar2;
    id_local._4_4_ = 0;
    break;
  case 0xd:
    unixModeBit((unixFile *)id,'\x10',(int *)pArg);
    id_local._4_4_ = 0;
    break;
  case 0x10:
    pcVar2 = (char *)sqlite3_malloc64((long)*(int *)&(id[1].pMethods)->xClose);
    if (pcVar2 != (char *)0x0) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar2);
      *(char **)pArg = pcVar2;
    }
    id_local._4_4_ = 0;
    break;
  case 0x12:
    psStack_48 = *pArg;
    local_4c = 0;
    if (sqlite3Config.mxMmap < (long)psStack_48) {
      psStack_48 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    }
    *(sqlite3_io_methods **)pArg = id[0xc].pMethods;
    if ((((-1 < (long)psStack_48) && (psStack_48 != id[0xc].pMethods)) &&
        (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psStack_48, 0 < (long)id[10].pMethods)) {
      unixUnmapfile((unixFile *)id);
      local_4c = unixMapfile((unixFile *)id,-1);
    }
    id_local._4_4_ = local_4c;
    break;
  case 0x14:
    iVar1 = fileHasMoved((unixFile *)id);
    *(int *)pArg = iVar1;
    id_local._4_4_ = 0;
    break;
  case 0x28:
    id_local._4_4_ = unixFcntlExternalReader((unixFile *)id,(int *)pArg);
  }
  return id_local._4_4_;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      int iOld = pFile->iBusyTimeout;
      pFile->iBusyTimeout = *(int*)pArg;
      *(int*)pArg = iOld;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */

    case SQLITE_FCNTL_EXTERNAL_READER: {
#ifndef SQLITE_OMIT_WAL
      return unixFcntlExternalReader((unixFile*)id, (int*)pArg);
#else
      *(int*)pArg = 0;
      return SQLITE_OK;
#endif
    }
  }
  return SQLITE_NOTFOUND;
}